

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O2

void __thiscall cmUVProcessChain::cmUVProcessChain(cmUVProcessChain *this)

{
  std::make_unique<cmUVProcessChain::InternalData>();
  ::cm::uv_loop_ptr::init
            (&((this->Data)._M_t.
               super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
               .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl)->Loop,
             (EVP_PKEY_CTX *)0x0);
  return;
}

Assistant:

cmUVProcessChain::cmUVProcessChain()
  : Data(cm::make_unique<InternalData>())
{
  this->Data->Loop.init();
}